

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_small_type_uses.cpp
# Opt level: O0

spv_result_t spvtools::val::ValidateSmallTypeUses(ValidationState_t *_,Instruction *inst)

{
  bool bVar1;
  uint32_t uVar2;
  Op OVar3;
  spv_result_t sVar4;
  vector<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
  *this;
  reference ppVar5;
  DiagnosticStream *this_00;
  DiagnosticStream local_228;
  Instruction *local_50;
  Instruction *user;
  pair<const_spvtools::val::Instruction_*,_unsigned_int> use;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
  *__range2;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  bVar1 = ValidationState_t::HasCapability(_,CapabilityShader);
  if ((bVar1) && (uVar2 = Instruction::type_id(inst), uVar2 != 0)) {
    uVar2 = Instruction::type_id(inst);
    bVar1 = ValidationState_t::ContainsLimitedUseIntOrFloatType(_,uVar2);
    if (bVar1) {
      uVar2 = Instruction::type_id(inst);
      bVar1 = ValidationState_t::IsPointerType(_,uVar2);
      if (bVar1) {
        return SPV_SUCCESS;
      }
      this = Instruction::uses(inst);
      __end2 = std::
               vector<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
               ::begin(this);
      use._8_8_ = std::
                  vector<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                  ::end(this);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          (&__end2,(__normal_iterator<const_std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_*,_std::vector<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>_>
                                    *)&use.second);
        if (!bVar1) {
          return SPV_SUCCESS;
        }
        ppVar5 = __gnu_cxx::
                 __normal_iterator<const_std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_*,_std::vector<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>_>
                 ::operator*(&__end2);
        local_50 = ppVar5->first;
        use.first = *(Instruction **)&ppVar5->second;
        user = local_50;
        OVar3 = Instruction::opcode(local_50);
        if ((((OVar3 != OpStore) && (OVar3 != OpDecorate)) && (OVar3 != OpCopyObject)) &&
           ((2 < OVar3 - OpUConvert && (OVar3 != OpDecorateId)))) break;
        __gnu_cxx::
        __normal_iterator<const_std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_*,_std::vector<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>_>
        ::operator++(&__end2);
      }
      ValidationState_t::diag(&local_228,_,SPV_ERROR_INVALID_ID,local_50);
      this_00 = DiagnosticStream::operator<<
                          (&local_228,(char (*) [35])"Invalid use of 8- or 16-bit result");
      sVar4 = DiagnosticStream::operator_cast_to_spv_result_t(this_00);
      DiagnosticStream::~DiagnosticStream(&local_228);
      return sVar4;
    }
  }
  return SPV_SUCCESS;
}

Assistant:

spv_result_t ValidateSmallTypeUses(ValidationState_t& _,
                                   const Instruction* inst) {
  if (!_.HasCapability(spv::Capability::Shader) || inst->type_id() == 0 ||
      !_.ContainsLimitedUseIntOrFloatType(inst->type_id())) {
    return SPV_SUCCESS;
  }

  if (_.IsPointerType(inst->type_id())) return SPV_SUCCESS;

  // The validator should previously have checked ways to generate 8- or 16-bit
  // types. So we only need to considervalid paths from source to sink.
  // When restricted, uses of 8- or 16-bit types can only be stores,
  // width-only conversions, decorations and copy object.
  for (auto use : inst->uses()) {
    const auto* user = use.first;
    switch (user->opcode()) {
      case spv::Op::OpDecorate:
      case spv::Op::OpDecorateId:
      case spv::Op::OpCopyObject:
      case spv::Op::OpStore:
      case spv::Op::OpFConvert:
      case spv::Op::OpUConvert:
      case spv::Op::OpSConvert:
        break;
      default:
        return _.diag(SPV_ERROR_INVALID_ID, user)
               << "Invalid use of 8- or 16-bit result";
    }
  }

  return SPV_SUCCESS;
}